

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O2

void __thiscall
deci::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,stack_symbol_type *that)

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  long lVar6;
  value_type *this_00;
  
  (this->super_basic_symbol<deci::parser_t::by_state>).super_by_state.state =
       (that->super_basic_symbol<deci::parser_t::by_state>).super_by_state.state;
  (this->super_basic_symbol<deci::parser_t::by_state>).value.yytypeid_ = (type_info *)0x0;
  *(undefined8 *)&(this->super_basic_symbol<deci::parser_t::by_state>).value.field_0 = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<deci::parser_t::by_state>).value.field_0 + 8) = 0
  ;
  *(undefined8 *)((long)&(this->super_basic_symbol<deci::parser_t::by_state>).value.field_0 + 0x10)
       = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<deci::parser_t::by_state>).value.field_0 + 0x18)
       = 0;
  pfVar1 = (that->super_basic_symbol<deci::parser_t::by_state>).location.begin.filename;
  cVar4 = (that->super_basic_symbol<deci::parser_t::by_state>).location.begin.line;
  cVar5 = (that->super_basic_symbol<deci::parser_t::by_state>).location.begin.column;
  cVar2 = (that->super_basic_symbol<deci::parser_t::by_state>).location.end.line;
  cVar3 = (that->super_basic_symbol<deci::parser_t::by_state>).location.end.column;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.end.filename =
       (that->super_basic_symbol<deci::parser_t::by_state>).location.end.filename;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.end.line = cVar2;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.end.column = cVar3;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.begin.filename = pfVar1;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.begin.line = cVar4;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.begin.column = cVar5;
  lVar6 = (long)(that->super_basic_symbol<deci::parser_t::by_state>).super_by_state.state;
  if ((lVar6 != 0) && ((byte)yystos_[lVar6] - 3 < 0x42)) {
    this_00 = &(this->super_basic_symbol<deci::parser_t::by_state>).value;
    switch((uint)(byte)yystos_[lVar6]) {
    case 3:
      value_type::move<double>(this_00,&(that->super_basic_symbol<deci::parser_t::by_state>).value);
      break;
    case 4:
    case 0x39:
      value_type::move<std::__cxx11::string>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_state>).value);
      break;
    case 0x2a:
    case 0x3f:
      value_type::move<deci::ast_arg_list_t*>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_state>).value);
      break;
    case 0x2b:
    case 0x2e:
      value_type::move<deci::ast_t*>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_state>).value);
      break;
    case 0x2f:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
      value_type::move<deci::ast_item_t*>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_state>).value);
      break;
    case 0x30:
      value_type::move<deci::ast_exit_t*>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_state>).value);
    }
  }
  (that->super_basic_symbol<deci::parser_t::by_state>).super_by_state.state = '\0';
  return;
}

Assistant:

parser_t ::stack_symbol_type::stack_symbol_type (YY_RVREF (stack_symbol_type) that)
    : super_type (YY_MOVE (that.state), YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_42_argument_list_: // "argument list"
      case symbol_kind::S_argument_list: // argument_list
        value.YY_MOVE_OR_COPY< ast_arg_list_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_exit_statement: // exit_statement
        value.YY_MOVE_OR_COPY< ast_exit_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_statement: // statement
      case symbol_kind::S_expression_statement: // expression_statement
      case symbol_kind::S_expression: // expression
      case symbol_kind::S_assign_expr: // assign_expr
      case symbol_kind::S_or_expr: // or_expr
      case symbol_kind::S_xor_expr: // xor_expr
      case symbol_kind::S_and_expr: // and_expr
      case symbol_kind::S_eql_expr: // eql_expr
      case symbol_kind::S_cmp_expr: // cmp_expr
      case symbol_kind::S_add_expr: // add_expr
      case symbol_kind::S_mul_expr: // mul_expr
      case symbol_kind::S_pow_expr: // pow_expr
      case symbol_kind::S_unary_expr: // unary_expr
      case symbol_kind::S_postfix_expr: // postfix_expr
      case symbol_kind::S_primary_expr: // primary_expr
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_for_statement: // for_statement
      case symbol_kind::S_while_statement: // while_statement
      case symbol_kind::S_repeat_statement: // repeat_statement
        value.YY_MOVE_OR_COPY< ast_item_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_43_statement_list_: // "statement list"
      case symbol_kind::S_statement_list: // statement_list
        value.YY_MOVE_OR_COPY< ast_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_NUMBER: // "number"
        value.YY_MOVE_OR_COPY< double > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "identifier"
      case symbol_kind::S_CMP_OPERATOR: // CMP_OPERATOR
        value.YY_MOVE_OR_COPY< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

#if 201103L <= YY_CPLUSPLUS
    // that is emptied.
    that.state = empty_state;
#endif
  }